

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int listk(lua_State *L)

{
  long lVar1;
  int iVar2;
  int local_1c;
  int i;
  Proto *p;
  lua_State *L_local;
  
  iVar2 = lua_type(L,1);
  if (iVar2 == 6) {
    iVar2 = lua_iscfunction(L,1);
    if (iVar2 == 0) goto LAB_001661e7;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_001661e7:
  if (L->ci->func[1].tt_ != 0x8006) {
    __assert_fail("(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x278,"int listk(lua_State *)");
  }
  if ((L->ci->func[1].value_.gc)->tt == '\x06') {
    lVar1 = *(long *)(L->ci->func[1].value_.f + 0x18);
    lua_createtable(L,*(int *)(lVar1 + 0x14),0);
    for (local_1c = 0; local_1c < *(int *)(lVar1 + 0x14); local_1c = local_1c + 1) {
      pushobject(L,(TValue *)(*(long *)(lVar1 + 0x30) + (long)local_1c * 0x10));
      lua_rawseti(L,-2,(long)(local_1c + 1));
    }
    return 1;
  }
  __assert_fail("((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x278,"int listk(lua_State *)");
}

Assistant:

static int listk (lua_State *L) {
  Proto *p;
  int i;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  lua_createtable(L, p->sizek, 0);
  for (i=0; i<p->sizek; i++) {
    pushobject(L, p->k+i);
    lua_rawseti(L, -2, i+1);
  }
  return 1;
}